

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

void __thiscall FEventTree::PrintTree(FEventTree *this,FEvent *event)

{
  char local_88 [8];
  char buff [100];
  FEvent *event_local;
  FEventTree *this_local;
  
  if ((FEventTree *)event != this) {
    PrintTree(this,event->Left);
    c_sqrt(event->Distance / 4294967296.0);
    sprintf(local_88," Distance %g, vertex %d, seg %u\n",(ulong)(uint)(event->Info).Vertex,
            (ulong)(event->Info).FrontSeg);
    Printf(5,"%s",local_88);
    PrintTree(this,event->Right);
  }
  return;
}

Assistant:

void FEventTree::PrintTree (const FEvent *event) const
{
	// Use the CRT's sprintf so that it shares the same formatting as ZDBSP's output.
	char buff[100];
	if (event != &Nil)
	{
		PrintTree(event->Left);
		sprintf(buff, " Distance %g, vertex %d, seg %u\n",
			g_sqrt(event->Distance/4294967296.0), event->Info.Vertex, (unsigned)event->Info.FrontSeg);
		Printf(PRINT_LOG, "%s", buff);
		PrintTree(event->Right);
	}
}